

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  element_type *this_00;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newVal;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdb8;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdc0;
  int i_00;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdc8;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdd0;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  undefined1 local_1f4 [76];
  double in_stack_fffffffffffffe58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe60;
  undefined1 local_154 [108];
  undefined1 local_e8 [80];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  byte local_81;
  undefined8 local_80;
  int local_78;
  int local_74;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined8 local_10;
  undefined1 *local_8;
  
  local_81 = in_R8B & 1;
  if ((-1 < in_ESI) && (-1 < in_EDX)) {
    local_80 = in_RCX;
    local_78 = in_EDX;
    local_74 = in_ESI;
    local_90 = rowVector_w(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20)
                          );
    local_98 = colVector_w(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20)
                          );
    local_58 = local_e8;
    local_60 = local_80;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdc0,
               (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdb8);
    tolerances(in_stack_fffffffffffffdb8);
    this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4ec7ff);
    Tolerances::epsilon(this_00);
    bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4ec835);
    if (bVar2) {
      local_68 = local_154;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdc0);
      if ((local_81 & 1) == 0) {
        local_8 = local_154;
        local_10 = local_80;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdc0,
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdb8);
      }
      else {
        plVar1 = *(long **)(in_RDI + 0x1e8);
        local_48 = local_1f4;
        local_50 = local_80;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdc0,
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdb8);
        (**(code **)(*plVar1 + 0x150))
                  (&stack0xfffffffffffffe5c,plVar1,in_RDI,local_74,local_78,local_1f4);
        local_38 = local_154;
        local_40 = &stack0xfffffffffffffe5c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdc0,
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdb8);
      }
      iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos(in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      if ((iVar3 < 0) ||
         (iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos(in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20)),
         iVar3 < 0)) {
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
               (int)in_stack_fffffffffffffdc8,(int *)in_stack_fffffffffffffdc0,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_fffffffffffffdb8);
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
               (int)in_stack_fffffffffffffdc8,(int *)in_stack_fffffffffffffdc0,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_fffffffffffffdb8);
      }
      else {
        pSVar5 = local_90;
        iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos(local_90,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
        local_18 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::value(pSVar5,iVar3);
        local_20 = local_154;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdc0,
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdb8);
        this_01 = local_98;
        iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos(pSVar5,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
        local_28 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::value(this_01,iVar3);
        local_30 = local_154;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdc0,
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdb8);
      }
    }
    else {
      iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos(in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      i_00 = (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
      if ((-1 < iVar3) &&
         (iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos(in_stack_fffffffffffffdc8,i_00), -1 < iVar3)) {
        pSVar5 = local_90;
        uVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos(in_stack_fffffffffffffdc8,i_00);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove(pSVar5,(char *)(ulong)uVar4);
        pSVar5 = local_98;
        uVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos(in_stack_fffffffffffffdc8,(int)((ulong)local_98 >> 0x20));
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove(pSVar5,(char *)(ulong)uVar4);
      }
    }
  }
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }